

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O2

CBlockIndex * __thiscall CBlockIndex::GetAncestor(CBlockIndex *this,int height)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int height_00;
  CBlockIndex *pCVar4;
  int height_01;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  height_01 = this->nHeight;
  if (height < 0 || height_01 < height) {
    pCVar4 = (CBlockIndex *)0x0;
  }
  else {
    while (pCVar4 = this, height < height_01) {
      iVar2 = GetSkipHeight(height_01);
      height_00 = height_01 + -1;
      iVar3 = GetSkipHeight(height_00);
      this = pCVar4->pskip;
      if (((this == (CBlockIndex *)0x0) ||
          ((height_01 = height, iVar2 != height &&
           ((iVar2 <= height || (height_01 = iVar2, height <= iVar3 && iVar3 < iVar2 + -2)))))) &&
         (this = pCVar4->pprev, height_01 = height_00, pCVar4->pprev == (CBlockIndex *)0x0)) {
        __assert_fail("pindexWalk->pprev",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/chain.cpp"
                      ,0x70,"const CBlockIndex *CBlockIndex::GetAncestor(int) const");
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return pCVar4;
}

Assistant:

const CBlockIndex* CBlockIndex::GetAncestor(int height) const
{
    if (height > nHeight || height < 0) {
        return nullptr;
    }

    const CBlockIndex* pindexWalk = this;
    int heightWalk = nHeight;
    while (heightWalk > height) {
        int heightSkip = GetSkipHeight(heightWalk);
        int heightSkipPrev = GetSkipHeight(heightWalk - 1);
        if (pindexWalk->pskip != nullptr &&
            (heightSkip == height ||
             (heightSkip > height && !(heightSkipPrev < heightSkip - 2 &&
                                       heightSkipPrev >= height)))) {
            // Only follow pskip if pprev->pskip isn't better than pskip->pprev.
            pindexWalk = pindexWalk->pskip;
            heightWalk = heightSkip;
        } else {
            assert(pindexWalk->pprev);
            pindexWalk = pindexWalk->pprev;
            heightWalk--;
        }
    }
    return pindexWalk;
}